

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::FlushChunks(idx2_file *Idx2,encode_data *E)

{
  int iVar1;
  array<idx2::t2<unsigned_int,_idx2::channel_*>_> *Array;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  t2<unsigned_int,_idx2::channel_*> *Beg;
  double dVar9;
  uint *puVar10;
  FILE *__s;
  size_t sVar11;
  byte *pbVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  byte *pbVar16;
  long lVar17;
  long lVar18;
  u64 *puVar19;
  channel *pcVar20;
  chunk_meta_info *Cm;
  chunk_meta_info *pcVar21;
  long *in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 in_XMM2_Qb;
  stref sVar25;
  file_id FileId;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  long lStack_78;
  allocator *local_70;
  anon_union_8_2_2df48d06_for_stref_0 local_68;
  long lStack_60;
  allocator *local_58;
  bitstream *local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  Array = &E->SortedChannels;
  GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(Array,(E->Channels).Size);
  (E->SortedChannels).Size = 0;
  lVar15 = (E->Channels).LogCapacity;
  lVar17 = 1L << ((byte)lVar15 & 0x3f);
  lVar18 = lVar17;
  if (lVar15 != 0x3f) {
    lVar14 = 0;
    lVar15 = 0;
    if (0 < lVar17) {
      lVar15 = lVar17;
    }
    do {
      lVar18 = lVar14;
      if ((E->Channels).Stats[lVar14] == Occupied) break;
      lVar14 = lVar14 + 1;
      lVar18 = lVar17;
    } while (lVar15 + 1 != lVar14);
  }
  if (lVar18 != 1L << ((byte)(E->Channels).LogCapacity & 0x3f)) {
    pcVar20 = (E->Channels).Vals + lVar18;
    puVar10 = (E->Channels).Keys + lVar18;
    do {
      uVar8 = *puVar10;
      if ((E->SortedChannels).Capacity <= (E->SortedChannels).Size) {
        GrowCapacity<idx2::t2<unsigned_int,idx2::channel*>>(Array,0);
      }
      pbVar16 = (E->SortedChannels).Buffer.Data;
      lVar15 = (E->SortedChannels).Size;
      (E->SortedChannels).Size = lVar15 + 1;
      lVar15 = lVar15 * 0x10;
      *(uint *)(pbVar16 + lVar15) = uVar8;
      *(channel **)(pbVar16 + lVar15 + 8) = pcVar20;
      lVar15 = lVar18 * -0xd8;
      lVar17 = lVar18 * -4;
      do {
        lVar15 = lVar15 + -0xd8;
        lVar17 = lVar17 + -4;
        lVar14 = lVar18 + 1;
        lVar18 = lVar18 + 1;
      } while ((E->Channels).Stats[lVar14] != Occupied);
      puVar10 = (uint *)((long)(E->Channels).Keys - lVar17);
      pcVar20 = (channel *)((long)(E->Channels).Vals - lVar15);
    } while (1L << ((byte)(E->Channels).LogCapacity & 0x3f) != lVar18);
  }
  Beg = (t2<unsigned_int,_idx2::channel_*> *)(E->SortedChannels).Buffer.Data;
  InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>(Beg,Beg + (E->SortedChannels).Size);
  if ((E->SortedChannels).Size != 0) {
    puVar10 = (uint *)(Array->Buffer).Data;
    do {
      uVar8 = *puVar10;
      WriteChunk(Idx2,E,*(channel **)(puVar10 + 2),(byte)uVar8 & 0xf,(i8)(uVar8 >> 4),
                 (i16)(uVar8 >> 0x10));
      puVar10 = puVar10 + 4;
    } while (puVar10 != (uint *)((E->SortedChannels).Buffer.Data + (E->SortedChannels).Size * 0x10))
    ;
  }
  lVar15 = (E->ChunkMeta).LogCapacity;
  lVar17 = 1L << ((byte)lVar15 & 0x3f);
  lVar18 = lVar17;
  if (lVar15 != 0x3f) {
    lVar14 = 0;
    lVar15 = 0;
    if (0 < lVar17) {
      lVar15 = lVar17;
    }
    do {
      lVar18 = lVar14;
      if ((E->ChunkMeta).Stats[lVar14] == Occupied) break;
      lVar14 = lVar14 + 1;
      lVar18 = lVar17;
    } while (lVar15 + 1 != lVar14);
  }
  if (lVar18 != 1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f)) {
    pcVar21 = (E->ChunkMeta).Vals + lVar18;
    puVar19 = (E->ChunkMeta).Keys + lVar18;
    local_48 = &E->CompressedChunkAddresses;
    do {
      ConstructFilePath((file_id *)&local_68,Idx2,*puVar19);
      if (local_58 != (allocator *)*puVar19) {
        ConstructFilePath((file_id *)&local_80,Idx2,*puVar19);
        local_58 = local_70;
        local_68 = local_80;
        lStack_60 = lStack_78;
      }
      __s = fopen(local_68.Ptr,"ab");
      if (__s == (FILE *)0x0) {
        local_40.Ptr = local_68.Ptr;
        sVar11 = strlen(local_68.Ptr);
        local_38 = (undefined4)sVar11;
        sVar25 = GetParentPath((stref *)&local_40);
        local_80 = sVar25.field_0;
        lStack_78 = CONCAT44(lStack_78._4_4_,sVar25.Size);
        CreateFullDir((stref *)&local_80);
        __s = fopen(local_68.Ptr,"ab");
      }
      puVar19 = (u64 *)(pcVar21->Sizes).BitPtr;
      *puVar19 = (pcVar21->Sizes).BitBuf;
      uVar8 = (pcVar21->Sizes).BitPos;
      if (0 < (int)uVar8 >> 3) {
        (pcVar21->Sizes).BitBuf =
             ((pcVar21->Sizes).BitBuf >> 1) >> (((byte)uVar8 & 0xf8) - 1 & 0x3f);
      }
      pbVar12 = (byte *)((long)puVar19 + (long)((int)uVar8 >> 3));
      (pcVar21->Sizes).BitPtr = pbVar12;
      (pcVar21->Sizes).BitPos = uVar8 & 7;
      pbVar16 = (pcVar21->Sizes).Stream.Data;
      fwrite(pbVar16,(size_t)(pbVar12 + ((ulong)((uVar8 & 7) + 7 >> 3) - (long)pbVar16)),1,__s);
      iVar13 = (pcVar21->Sizes).BitPos;
      iVar1 = iVar13 + 7;
      iVar13 = iVar13 + 0xe;
      if (-1 < iVar1) {
        iVar13 = iVar1;
      }
      pbVar16 = (pcVar21->Sizes).BitPtr + ((long)(iVar13 >> 3) - (long)(pcVar21->Sizes).Stream.Data)
      ;
      auVar22._0_8_ = (double)(long)pbVar16;
      auVar22._8_8_ = in_XMM2_Qb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = _ZN4idx2L14ChunkSizesStatE_0;
      auVar2 = vminsd_avx(auVar22,auVar2);
      _ZN4idx2L14ChunkSizesStatE_0 = auVar2._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = _ZN4idx2L14ChunkSizesStatE_1;
      auVar2 = vmaxsd_avx(auVar22,auVar3);
      _ZN4idx2L14ChunkSizesStatE_1 = auVar2._0_8_;
      _ZN4idx2L14ChunkSizesStatE_2 = auVar22._0_8_ + _ZN4idx2L14ChunkSizesStatE_2;
      _ZN4idx2L14ChunkSizesStatE_3 = _ZN4idx2L14ChunkSizesStatE_3 + 1;
      _ZN4idx2L14ChunkSizesStatE_4 = auVar22._0_8_ * auVar22._0_8_ + _ZN4idx2L14ChunkSizesStatE_4;
      local_80._0_4_ = (int)pbVar16;
      fwrite(&local_80,4,1,__s);
      lStack_78 = (pcVar21->Addrs).Size << 3;
      local_80 = (anon_union_8_2_2df48d06_for_stref_0)(pcVar21->Addrs).Buffer.Data;
      local_70 = (pcVar21->Addrs).Buffer.Alloc;
      CompressBufZstd((buffer *)&local_80,local_48);
      pbVar16 = (E->CompressedChunkAddresses).Stream.Data;
      iVar13 = (E->CompressedChunkAddresses).BitPos;
      iVar1 = iVar13 + 7;
      iVar13 = iVar13 + 0xe;
      if (-1 < iVar1) {
        iVar13 = iVar1;
      }
      fwrite(pbVar16,(size_t)((E->CompressedChunkAddresses).BitPtr +
                             ((long)(iVar13 >> 3) - (long)pbVar16)),1,__s);
      iVar13 = (E->CompressedChunkAddresses).BitPos;
      iVar1 = iVar13 + 7;
      iVar13 = iVar13 + 0xe;
      if (-1 < iVar1) {
        iVar13 = iVar1;
      }
      local_80._0_4_ =
           (iVar13 >> 3) +
           (*(int *)&(E->CompressedChunkAddresses).BitPtr -
           *(int *)&(E->CompressedChunkAddresses).Stream.Data);
      fwrite(&local_80,4,1,__s);
      local_80._0_4_ = (int)(pcVar21->Addrs).Size;
      fwrite(&local_80,4,1,__s);
      dVar9 = (double)(pcVar21->Addrs).Size * 8.0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_0;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar9;
      auVar2 = vminsd_avx(auVar23,auVar4);
      _ZN4idx2L30UncompressedChunkAddressesStatE_0 = auVar2._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = _ZN4idx2L30UncompressedChunkAddressesStatE_1;
      auVar2 = vmaxsd_avx(auVar23,auVar5);
      _ZN4idx2L30UncompressedChunkAddressesStatE_1 = auVar2._0_8_;
      _ZN4idx2L30UncompressedChunkAddressesStatE_2 =
           dVar9 + _ZN4idx2L30UncompressedChunkAddressesStatE_2;
      _ZN4idx2L30UncompressedChunkAddressesStatE_3 =
           _ZN4idx2L30UncompressedChunkAddressesStatE_3 + 1;
      _ZN4idx2L30UncompressedChunkAddressesStatE_4 =
           dVar9 * dVar9 + _ZN4idx2L30UncompressedChunkAddressesStatE_4;
      iVar13 = (E->CompressedChunkAddresses).BitPos;
      iVar1 = iVar13 + 7;
      iVar13 = iVar13 + 0xe;
      if (-1 < iVar1) {
        iVar13 = iVar1;
      }
      auVar24._0_8_ =
           (double)(long)((E->CompressedChunkAddresses).BitPtr +
                         ((long)(iVar13 >> 3) - (long)(E->CompressedChunkAddresses).Stream.Data));
      auVar24._8_8_ = in_XMM2_Qb;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_0;
      auVar2 = vminsd_avx(auVar24,auVar6);
      _ZN4idx2L28CompressedChunkAddressesStatE_0 = auVar2._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = _ZN4idx2L28CompressedChunkAddressesStatE_1;
      auVar2 = vmaxsd_avx(auVar24,auVar7);
      _ZN4idx2L28CompressedChunkAddressesStatE_1 = auVar2._0_8_;
      _ZN4idx2L28CompressedChunkAddressesStatE_2 =
           auVar24._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_2;
      _ZN4idx2L28CompressedChunkAddressesStatE_3 = _ZN4idx2L28CompressedChunkAddressesStatE_3 + 1;
      _ZN4idx2L28CompressedChunkAddressesStatE_4 =
           auVar24._0_8_ * auVar24._0_8_ + _ZN4idx2L28CompressedChunkAddressesStatE_4;
      if (__s != (FILE *)0x0) {
        fclose(__s);
      }
      lVar15 = lVar18 * -0x60;
      lVar17 = lVar18 * -8;
      do {
        lVar15 = lVar15 + -0x60;
        lVar17 = lVar17 + -8;
        lVar14 = lVar18 + 1;
        lVar18 = lVar18 + 1;
      } while ((E->ChunkMeta).Stats[lVar14] != Occupied);
      puVar19 = (u64 *)((long)(E->ChunkMeta).Keys - lVar17);
      pcVar21 = (chunk_meta_info *)((long)(E->ChunkMeta).Vals - lVar15);
    } while (1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f) != lVar18);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x180;
  return (error<idx2::idx2_err_code>)ZEXT816(0x1bd71d);
}

Assistant:

error<idx2_err_code>
FlushChunks(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedChannels, Size(E->Channels));
    Clear(&E->SortedChannels);
    idx2_ForEach (Ch, E->Channels)
    {
      PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
    }
    InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
    idx2_ForEach (Ch, E->SortedChannels)
    {
      i8 Level = GetLevelFromChannelKey(Ch->First);
      i8 Subband = GetSubbandFromChannelKey(Ch->First);
      i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
      // printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
      WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane); //just call WriteChunk
    }
    return idx2_Error(idx2_err_code::NoError);
  }
#endif
  /* write the chunks */
  Reserve(&E->SortedChannels, Size(E->Channels));
  Clear(&E->SortedChannels);
  idx2_ForEach (Ch, E->Channels)
  {
    PushBack(&E->SortedChannels, t2<u32, channel*>{ *Ch.Key, Ch.Val });
  }
  InsertionSort(Begin(E->SortedChannels), End(E->SortedChannels));
  idx2_ForEach (Ch, E->SortedChannels)
  {
    i8 Level = GetLevelFromChannelKey(Ch->First);
    i8 Subband = GetSubbandFromChannelKey(Ch->First);
    i16 BitPlane = BitPlaneFromChannelKey(Ch->First);
    //printf("key %llu level %d subband %d bitplane %d\n", Ch->First, Level, Subband, BitPlane);
    WriteChunk(Idx2, E, Ch->Second, Level, Subband, BitPlane);
  }

  /* write the chunk metadata */
  idx2_ForEach (CmIt, E->ChunkMeta)
  {
    chunk_meta_info* Cm = CmIt.Val;
    file_id FileId = ConstructFilePath(Idx2, *CmIt.Key);
    if (FileId.Id != *CmIt.Key)
    {
      FileId = ConstructFilePath(Idx2, *CmIt.Key);
    }
    //printf("%llu %s\n", FileId.Id, FileId.Name.ConstPtr);
    idx2_Assert(FileId.Id == *CmIt.Key);
    /* compress and write chunk sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(&Cm->Sizes);
    WriteBuffer(Fp, ToBuffer(Cm->Sizes));
    ChunkSizesStat.Add((f64)Size(Cm->Sizes));
    WritePOD(Fp, (int)Size(Cm->Sizes));
    /* compress and write chunk addresses */
    CompressBufZstd(ToBuffer(Cm->Addrs), &E->CompressedChunkAddresses);
    WriteBuffer(Fp, ToBuffer(E->CompressedChunkAddresses));
    // write size of the compressed chunk addresses
    WritePOD(Fp, (int)Size(E->CompressedChunkAddresses));
    WritePOD(Fp, (int)Size(Cm->Addrs)); // number of chunks
    UncompressedChunkAddressesStat.Add((f64)Size(Cm->Addrs) * sizeof(Cm->Addrs[0]));
    CompressedChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
  }

  return idx2_Error(idx2_err_code::NoError);
}